

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestVat::ConnectionImpl::unblock(ConnectionImpl *this)

{
  PromiseFulfiller<void> *pPVar1;
  ForkHub<kj::_::Void> *pFVar2;
  Disposer *pDVar3;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  pPVar1 = (this->currentBlockFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
    if ((this->currentBlock).ptr.isSet == true) {
      (this->currentBlock).ptr.isSet = false;
      pFVar2 = (this->currentBlock).ptr.field_1.value.hub.ptr;
      if (pFVar2 != (ForkHub<kj::_::Void> *)0x0) {
        (this->currentBlock).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
        pDVar3 = (this->currentBlock).ptr.field_1.value.hub.disposer;
        (**pDVar3->_vptr_Disposer)
                  (pDVar3,(_func_int *)
                          ((long)&(pFVar2->super_ForkHubBase).super_PromiseArenaMember.
                                  _vptr_PromiseArenaMember +
                          (long)(pFVar2->super_ForkHubBase).super_PromiseArenaMember.
                                _vptr_PromiseArenaMember[-2]));
      }
    }
    pDVar3 = (this->currentBlockFulfiller).ptr.disposer;
    pPVar1 = (this->currentBlockFulfiller).ptr.ptr;
    (this->currentBlockFulfiller).ptr.disposer = (Disposer *)0x0;
    (this->currentBlockFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(_func_int *)
                        ((long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector +
                        (long)(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2]));
    }
    return;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void unblock() {
      // Allow blocked messages to proceed.
      KJ_REQUIRE_NONNULL(currentBlockFulfiller)->fulfill();
      currentBlock = kj::none;
      currentBlockFulfiller = kj::none;
    }